

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O3

void print_node3(Abc_Obj_t *pObj)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  char m [6];
  char local_1e [6];
  
  local_1e[0] = '\0';
  uVar1 = *(uint *)&pObj->field_0x14;
  if ((uVar1 & 0x10) != 0) {
    sVar2 = strlen(local_1e);
    (local_1e + sVar2)[0] = 'A';
    (local_1e + sVar2)[1] = '\0';
  }
  if ((uVar1 & 0x20) != 0) {
    sVar2 = strlen(local_1e);
    (local_1e + sVar2)[0] = 'B';
    (local_1e + sVar2)[1] = '\0';
  }
  if ((uVar1 & 0x40) != 0) {
    sVar2 = strlen(local_1e);
    (local_1e + sVar2)[0] = 'C';
    (local_1e + sVar2)[1] = '\0';
  }
  printf("\nnode %d type=%d mark=%d %s\n",(ulong)(uint)pObj->Id,(ulong)(uVar1 & 0xf),
         (ulong)*(ushort *)(pManMR->pDataArray + (uint)pObj->Id),local_1e);
  puts("fanouts");
  if (0 < (pObj->vFanouts).nSize) {
    lVar3 = 0;
    do {
      print_node((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]]);
      putchar(10);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (pObj->vFanouts).nSize);
  }
  puts("fanins");
  if (0 < (pObj->vFanins).nSize) {
    lVar3 = 0;
    do {
      print_node((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]]);
      putchar(10);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (pObj->vFanins).nSize);
  }
  return;
}

Assistant:

void
print_node3(Abc_Obj_t *pObj) {
  int i;
  Abc_Obj_t * pNext;
  char m[6];

  m[0] = 0;
  if (pObj->fMarkA)
    strcat(m, "A");
  if (pObj->fMarkB)
    strcat(m, "B");
  if (pObj->fMarkC)
    strcat(m, "C");

  printf("\nnode %d type=%d mark=%d %s\n", Abc_ObjId(pObj), Abc_ObjType(pObj), FDATA(pObj)->mark, m);
  printf("fanouts\n");
  Abc_ObjForEachFanout( pObj, pNext, i ) {
    print_node(pNext);
    printf("\n");
  }
  printf("fanins\n");
  Abc_ObjForEachFanin( pObj, pNext, i ) {
    print_node(pNext);
    printf("\n");
  }
}